

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O1

void render_svg(element_t *element,render_context_t *context,render_state_t *state)

{
  float fVar1;
  float x_00;
  float y_00;
  float fVar2;
  float fVar3;
  length_t h;
  length_t w;
  length_t y;
  length_t x;
  length_t local_50;
  length_t local_48;
  length_t local_40;
  length_t local_38;
  
  if (element->parent == (element *)0x0) {
    fVar1 = context->document->width;
    fVar2 = context->document->height;
    x_00 = 0.0;
    y_00 = 0.0;
  }
  else {
    local_38.value = 0.0;
    local_38.type = length_type_fixed;
    local_40.value = 0.0;
    local_40.type = length_type_fixed;
    local_48.value = 100.0;
    local_48.type = length_type_percent;
    local_50.value = 100.0;
    local_50.type = length_type_percent;
    parse_length(element,0x2a,&local_38,true,false);
    parse_length(element,0x2d,&local_40,true,false);
    parse_length(element,0x29,&local_48,false,false);
    parse_length(element,0x10,&local_50,false,false);
    fVar1 = 0.0;
    if (local_38.type == length_type_percent) {
      fVar1 = state->view_width;
    }
    x_00 = local_38.value;
    if (local_38.type == length_type_percent) {
      x_00 = (fVar1 * local_38.value) / 100.0;
    }
    fVar1 = 0.0;
    if (local_40.type == length_type_percent) {
      fVar1 = state->view_height;
    }
    y_00 = local_40.value;
    if (local_40.type == length_type_percent) {
      y_00 = (fVar1 * local_40.value) / 100.0;
    }
    fVar2 = 0.0;
    if (local_48.type == length_type_percent) {
      fVar2 = state->view_width;
    }
    fVar1 = local_48.value;
    if (local_48.type == length_type_percent) {
      fVar1 = (fVar2 * local_48.value) / 100.0;
    }
    fVar3 = 0.0;
    if (local_50.type == length_type_percent) {
      fVar3 = state->view_height;
    }
    fVar2 = local_50.value;
    if (local_50.type == length_type_percent) {
      fVar2 = (fVar3 * local_50.value) / 100.0;
    }
  }
  render_symbol(element,context,state,x_00,y_00,fVar1,fVar2);
  return;
}

Assistant:

static void render_svg(const element_t* element, const render_context_t* context, render_state_t* state)
{
    if(element->parent == NULL) {
        render_symbol(element, context, state, 0.f, 0.f, context->document->width, context->document->height);
        return;
    }

    length_t x = {0, length_type_fixed};
    length_t y = {0, length_type_fixed};

    length_t w = {100, length_type_percent};
    length_t h = {100, length_type_percent};

    parse_length(element, ATTR_X, &x, true, false);
    parse_length(element, ATTR_Y, &y, true, false);
    parse_length(element, ATTR_WIDTH, &w, false, false);
    parse_length(element, ATTR_HEIGHT, &h, false, false);

    float _x = resolve_length(state, &x, 'x');
    float _y = resolve_length(state, &y, 'y');
    float _w = resolve_length(state, &w, 'x');
    float _h = resolve_length(state, &h, 'y');
    render_symbol(element, context, state, _x, _y, _w, _h);
}